

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trim_capabilities_pass.cpp
# Opt level: O2

optional<spv::Capability>
spvtools::opt::Handler_OpTypePointer_StorageUniformBufferBlock16(Instruction *instruction)

{
  long lVar1;
  bool bVar2;
  uint32_t uVar3;
  FeatureManager *feature_manager;
  DecorationManager *this;
  DefUseManager *this_00;
  _Elt_pointer puVar4;
  Instruction *this_01;
  ulong uVar5;
  _Optional_payload_base<spv::Capability> _Var6;
  long lVar7;
  _func_bool_Instruction_ptr *predicate;
  _Any_data local_a0;
  code *local_90;
  code *local_88;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>
  instructions_to_visit;
  
  if (instruction->opcode_ != OpTypePointer) {
    __assert_fail("instruction->opcode() == spv::Op::OpTypePointer && \"This handler only support OpTypePointer opcodes.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                  ,0xd6,
                  "std::optional<spv::Capability> spvtools::opt::Handler_OpTypePointer_StorageUniformBufferBlock16(const Instruction *)"
                 );
  }
  uVar3 = Instruction::GetSingleWordInOperand(instruction,0);
  _Var6._M_payload = (_Storage<spv::Capability,_true>)0x1151;
  _Var6._M_engaged = false;
  _Var6._5_3_ = 0;
  if (uVar3 == 2) {
    feature_manager = IRContext::get_feature_mgr(instruction->context_);
    bVar2 = anon_unknown_0::Has16BitCapability(feature_manager);
    if (bVar2) {
      this = IRContext::get_decoration_mgr(instruction->context_);
      bVar2 = IsTypeInst(instruction->opcode_);
      if (!bVar2) {
        __assert_fail("IsTypeInst(instruction->opcode()) && \"AnyTypeOf called with a non-type instruction.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp"
                      ,0x69,
                      "bool spvtools::opt::(anonymous namespace)::AnyTypeOf(const Instruction *, UnaryPredicate) [UnaryPredicate = (lambda at /workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:230:30)]"
                     );
      }
      std::stack<unsigned_int,std::deque<unsigned_int,std::allocator<unsigned_int>>>::
      stack<std::deque<unsigned_int,std::allocator<unsigned_int>>,void>(&instructions_to_visit);
      local_a0._0_4_ = Instruction::result_id(instruction);
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                (&instructions_to_visit.c,(uint *)local_a0._M_pod_data);
      this_00 = IRContext::get_def_use_mgr(instruction->context_);
      lVar1 = 0;
LAB_00467d23:
      lVar7 = lVar1;
      if (instructions_to_visit.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur !=
          instructions_to_visit.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur) {
        puVar4 = instructions_to_visit.c.
                 super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_cur;
        if (instructions_to_visit.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur ==
            instructions_to_visit.c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_first) {
          puVar4 = instructions_to_visit.c.
                   super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
        }
        this_01 = analysis::DefUseManager::GetDef(this_00,puVar4[-1]);
        std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&instructions_to_visit.c);
        lVar1 = 1;
        if (lVar7 == 0) {
          uVar3 = Instruction::result_id(this_01);
          predicate = (_func_bool_Instruction_ptr *)(ulong)uVar3;
          bVar2 = analysis::DecorationManager::HasDecoration(this,uVar3,BufferBlock);
          if (((!bVar2) ||
              (bVar2 = (anonymous_namespace)::AnyTypeOf<bool(*)(spvtools::opt::Instruction_const*)>
                                 (this_01,predicate), !bVar2)) &&
             (uVar5 = (ulong)this_01->opcode_, lVar1 = lVar7, uVar5 < 0x21)) {
            if ((0x31800000UL >> (uVar5 & 0x3f) & 1) == 0) {
              if (uVar5 == 0x1e) {
                local_a0._8_8_ = 0;
                local_88 = std::
                           _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:91:30)>
                           ::_M_invoke;
                local_90 = std::
                           _Function_handler<void_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/trim_capabilities_pass.cpp:91:30)>
                           ::_M_manager;
                local_a0._M_unused._0_8_ = (undefined8)&instructions_to_visit;
                Instruction::ForEachInOperand
                          (this_01,(function<void_(const_unsigned_int_*)> *)&local_a0);
                if (local_90 != (code *)0x0) {
                  (*local_90)(&local_a0,&local_a0,__destroy_functor);
                }
                goto LAB_00467d23;
              }
              if (uVar5 != 0x20) goto LAB_00467d23;
              uVar3 = 1;
            }
            else {
              uVar3 = 0;
            }
            uVar3 = Instruction::GetSingleWordInOperand(this_01,uVar3);
            local_a0._0_4_ = uVar3;
            std::deque<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
                      (&instructions_to_visit.c,(uint *)local_a0._M_pod_data);
          }
        }
        goto LAB_00467d23;
      }
      std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&instructions_to_visit)
      ;
      _Var6 = (_Optional_payload_base<spv::Capability>)(lVar7 << 0x20 | 0x1151);
    }
  }
  return (optional<spv::Capability>)_Var6;
}

Assistant:

static std::optional<spv::Capability>
Handler_OpTypePointer_StorageUniformBufferBlock16(
    const Instruction* instruction) {
  assert(instruction->opcode() == spv::Op::OpTypePointer &&
         "This handler only support OpTypePointer opcodes.");

  // This capability is only required if the variable has a Uniform storage
  // class.
  spv::StorageClass storage_class = spv::StorageClass(
      instruction->GetSingleWordInOperand(kOpTypePointerStorageClassIndex));
  if (storage_class != spv::StorageClass::Uniform) {
    return std::nullopt;
  }

  if (!Has16BitCapability(instruction->context()->get_feature_mgr())) {
    return std::nullopt;
  }

  const auto* decoration_mgr = instruction->context()->get_decoration_mgr();
  const bool matchesCondition =
      AnyTypeOf(instruction, [decoration_mgr](const Instruction* item) {
        if (!decoration_mgr->HasDecoration(item->result_id(),
                                           spv::Decoration::BufferBlock)) {
          return false;
        }

        return AnyTypeOf(item, is16bitType);
      });

  return matchesCondition
             ? std::optional(spv::Capability::StorageUniformBufferBlock16)
             : std::nullopt;
}